

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSSBOLayoutCase.cpp
# Opt level: O3

void deqp::gles31::bb::anon_unknown_11::copyBufferVarData
               (BufferVarLayoutEntry *dstEntry,BlockDataPtr *dstBlockPtr,
               BufferVarLayoutEntry *srcEntry,BlockDataPtr *srcBlockPtr)

{
  int iVar1;
  int iVar2;
  DataType DVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  uint uVar8;
  void *pvVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int iVar14;
  void *__src;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  void *__dest;
  ulong local_78;
  
  iVar1 = dstEntry->offset;
  pvVar9 = dstBlockPtr->ptr;
  iVar2 = srcEntry->offset;
  iVar10 = glu::getDataTypeScalarSize(dstEntry->type);
  DVar3 = dstEntry->type;
  uVar13 = dstEntry->topLevelArraySize;
  if (dstEntry->topLevelArraySize == 0) {
    uVar13 = dstBlockPtr->lastUnsizedArraySize;
  }
  if (0 < (int)uVar13) {
    iVar4 = dstEntry->arrayStride;
    iVar5 = dstEntry->topLevelArrayStride;
    iVar6 = srcEntry->arrayStride;
    iVar7 = srcEntry->topLevelArrayStride;
    uVar8 = dstBlockPtr->lastUnsizedArraySize;
    if (dstEntry->arraySize != 0) {
      uVar8 = dstEntry->arraySize;
    }
    local_78 = 0;
    do {
      if (0 < (int)uVar8) {
        uVar19 = 0;
        do {
          __dest = (void *)((long)pvVar9 +
                           (long)(iVar4 * (int)uVar19) + (long)(iVar5 * (int)local_78) + (long)iVar1
                           );
          __src = (void *)((long)&srcBlockPtr->ptr +
                          (long)(iVar6 * (int)uVar19) + (long)(iVar7 * (int)local_78) + (long)iVar2)
          ;
          if (DVar3 - TYPE_FLOAT_MAT2 < 9 || DVar3 - TYPE_DOUBLE_MAT2 < 9) {
            iVar11 = glu::getDataTypeMatrixNumRows(dstEntry->type);
            iVar12 = glu::getDataTypeMatrixNumColumns(dstEntry->type);
            if (0 < iVar12) {
              iVar14 = 0;
              do {
                if (0 < iVar11) {
                  iVar15 = 0;
                  iVar16 = 0;
                  do {
                    if (dstEntry->isRowMajor == true) {
                      iVar17 = dstEntry->matrixStride * iVar16 + iVar14 * 4;
                    }
                    else {
                      iVar17 = dstEntry->matrixStride * iVar14 + iVar15;
                    }
                    if (srcEntry->isRowMajor == true) {
                      iVar18 = srcEntry->matrixStride * iVar16 + iVar14 * 4;
                    }
                    else {
                      iVar18 = srcEntry->matrixStride * iVar14 + iVar15;
                    }
                    *(undefined4 *)((long)__dest + (long)iVar17) =
                         *(undefined4 *)((long)__src + (long)iVar18);
                    iVar16 = iVar16 + 1;
                    iVar15 = iVar15 + 4;
                  } while (iVar11 != iVar16);
                }
                iVar14 = iVar14 + 1;
              } while (iVar14 != iVar12);
            }
          }
          else {
            memcpy(__dest,__src,(long)(iVar10 << 2));
          }
          uVar19 = uVar19 + 1;
        } while (uVar19 != uVar8);
      }
      local_78 = local_78 + 1;
    } while (local_78 != uVar13);
  }
  return;
}

Assistant:

void copyBufferVarData (const BufferVarLayoutEntry& dstEntry, const BlockDataPtr& dstBlockPtr, const BufferVarLayoutEntry& srcEntry, const BlockDataPtr& srcBlockPtr)
{
	DE_ASSERT(dstEntry.arraySize <= srcEntry.arraySize);
	DE_ASSERT(dstEntry.topLevelArraySize <= srcEntry.topLevelArraySize);
	DE_ASSERT(dstBlockPtr.lastUnsizedArraySize <= srcBlockPtr.lastUnsizedArraySize);
	DE_ASSERT(dstEntry.type == srcEntry.type);

	deUint8* const			dstBasePtr			= (deUint8*)dstBlockPtr.ptr + dstEntry.offset;
	const deUint8* const	srcBasePtr			= (const deUint8*)srcBlockPtr.ptr + srcEntry.offset;
	const int				scalarSize			= glu::getDataTypeScalarSize(dstEntry.type);
	const bool				isMatrix			= glu::isDataTypeMatrix(dstEntry.type);
	const int				compSize			= sizeof(deUint32);
	const int				dstArraySize		= dstEntry.arraySize == 0 ? dstBlockPtr.lastUnsizedArraySize : dstEntry.arraySize;
	const int				dstArrayStride		= dstEntry.arrayStride;
	const int				dstTopLevelSize		= dstEntry.topLevelArraySize == 0 ? dstBlockPtr.lastUnsizedArraySize : dstEntry.topLevelArraySize;
	const int				dstTopLevelStride	= dstEntry.topLevelArrayStride;
	const int				srcArraySize		= srcEntry.arraySize == 0 ? srcBlockPtr.lastUnsizedArraySize : srcEntry.arraySize;
	const int				srcArrayStride		= srcEntry.arrayStride;
	const int				srcTopLevelSize		= srcEntry.topLevelArraySize == 0 ? srcBlockPtr.lastUnsizedArraySize : srcEntry.topLevelArraySize;
	const int				srcTopLevelStride	= srcEntry.topLevelArrayStride;

	DE_ASSERT(dstArraySize <= srcArraySize && dstTopLevelSize <= srcTopLevelSize);
	DE_UNREF(srcArraySize && srcTopLevelSize);

	for (int topElemNdx = 0; topElemNdx < dstTopLevelSize; topElemNdx++)
	{
		deUint8* const			dstTopPtr	= dstBasePtr + topElemNdx*dstTopLevelStride;
		const deUint8* const	srcTopPtr	= srcBasePtr + topElemNdx*srcTopLevelStride;

		for (int elementNdx = 0; elementNdx < dstArraySize; elementNdx++)
		{
			deUint8* const			dstElemPtr	= dstTopPtr + elementNdx*dstArrayStride;
			const deUint8* const	srcElemPtr	= srcTopPtr + elementNdx*srcArrayStride;

			if (isMatrix)
			{
				const int	numRows	= glu::getDataTypeMatrixNumRows(dstEntry.type);
				const int	numCols	= glu::getDataTypeMatrixNumColumns(dstEntry.type);

				for (int colNdx = 0; colNdx < numCols; colNdx++)
				{
					for (int rowNdx = 0; rowNdx < numRows; rowNdx++)
					{
						deUint8*		dstCompPtr	= dstElemPtr + (dstEntry.isRowMajor ? rowNdx*dstEntry.matrixStride + colNdx*compSize
																						: colNdx*dstEntry.matrixStride + rowNdx*compSize);
						const deUint8*	srcCompPtr	= srcElemPtr + (srcEntry.isRowMajor ? rowNdx*srcEntry.matrixStride + colNdx*compSize
																						: colNdx*srcEntry.matrixStride + rowNdx*compSize);

						DE_ASSERT((deIntptr)(srcCompPtr + compSize) - (deIntptr)srcBlockPtr.ptr <= (deIntptr)srcBlockPtr.size);
						DE_ASSERT((deIntptr)(dstCompPtr + compSize) - (deIntptr)dstBlockPtr.ptr <= (deIntptr)dstBlockPtr.size);
						deMemcpy(dstCompPtr, srcCompPtr, compSize);
					}
				}
			}
			else
			{
				DE_ASSERT((deIntptr)(srcElemPtr + scalarSize*compSize) - (deIntptr)srcBlockPtr.ptr <= (deIntptr)srcBlockPtr.size);
				DE_ASSERT((deIntptr)(dstElemPtr + scalarSize*compSize) - (deIntptr)dstBlockPtr.ptr <= (deIntptr)dstBlockPtr.size);
				deMemcpy(dstElemPtr, srcElemPtr, scalarSize*compSize);
			}
		}
	}
}